

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O1

void __thiscall
iu_MatcherFailure_x_iutest_x_LongDoubleNear_Test::Body
          (iu_MatcherFailure_x_iutest_x_LongDoubleNear_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _func_int **pp_Var3;
  longdouble lVar4;
  TestFlag TVar5;
  TestPartResultReporterInterface *pTVar6;
  TestFlag *pTVar7;
  Variable *pVVar8;
  AssertionResult *in_R8;
  ScopedSPITestFlag guard;
  AssertionResult iutest_spi_ar;
  AssertionResult iutest_ar;
  SPIFailureChecker iutest_failure_checker;
  TestFlag local_454;
  detail *local_450;
  long local_440 [2];
  string local_430;
  AssertionResult local_410;
  AssertionResult local_3e8;
  AssertionHelper local_3c0;
  longdouble local_38c;
  SPIFailureChecker local_380;
  undefined1 local_348 [16];
  FInt local_338;
  longdouble local_328;
  ios_base local_2c8 [272];
  undefined1 local_1b8 [32];
  char *local_198;
  undefined8 local_190;
  ios_base local_138 [264];
  
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_380.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_380.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023f038;
  local_380.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_454);
  local_348._0_8_ = &PTR__IMatcher_0023ed78;
  local_338.iv._10_6_ = 0;
  lVar4 = (longdouble)1;
  local_338.iv._0_4_ = SUB104(lVar4,0);
  local_338.iv._4_2_ = (undefined2)((unkuint10)lVar4 >> 0x20);
  local_338.iv._6_1_ = (undefined1)((unkuint10)lVar4 >> 0x30);
  local_338.iv._7_1_ = (undefined1)((unkuint10)lVar4 >> 0x38);
  local_338.iv._8_2_ = (undefined2)((unkuint10)lVar4 >> 0x40);
  local_328 = (longdouble)(anonymous_namespace)::ld0._0_10_;
  iutest::detail::FloatingPointNearMatcher<long_double>::operator()
            (&local_3e8,(FloatingPointNearMatcher<long_double> *)local_348,
             (longdouble *)(anonymous_namespace)::ld0);
  if (local_3e8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_348);
    std::ostream::_M_insert<long_double>((longdouble)(anonymous_namespace)::ld0._0_10_);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_348);
    std::ios_base::~ios_base(local_2c8);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_430,local_450,"LongDoubleNear(1.0l, ld0)",(char *)&local_3e8,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,local_430._M_dataplus._M_p,(allocator<char> *)local_348);
    local_3c0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_3c0.m_part_result.super_iuCodeMessage.m_line = 0x21f;
    local_3c0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_3c0,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_3c0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_3c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3c0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
    }
    if (local_450 != (detail *)local_440) {
      operator_delete(local_450,local_440[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  paVar2 = &local_3e8.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_3e8.m_message._M_dataplus._M_p,
                    local_3e8.m_message.field_2._M_allocated_capacity + 1);
  }
  TVar5.m_test_flags = local_454.m_test_flags;
  pTVar7 = iutest::TestFlag::GetInstance();
  pTVar7->m_test_flags = TVar5.m_test_flags;
  pp_Var3 = (_func_int **)(local_348 + 0x10);
  local_338.iv._0_4_ = 0x7261654e;
  local_338.iv._4_2_ = 0x203a;
  local_348._8_8_ = 6;
  local_338.iv._6_1_ = 0;
  local_348._0_8_ = pp_Var3;
  iutest::detail::SPIFailureChecker::GetResult(&local_410,&local_380,(string *)local_348);
  if ((_func_int **)local_348._0_8_ != pp_Var3) {
    operator_delete((void *)local_348._0_8_,
                    CONCAT17(local_338.iv._7_1_,
                             CONCAT16(local_338.iv._6_1_,
                                      CONCAT24(local_338.iv._4_2_,local_338.iv._0_4_))) + 1);
  }
  local_380.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023f0b8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_380.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar6 = local_380.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_380.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0023f0e0;
  pVVar8 = iutest::TestEnv::get_vars();
  pVVar8->m_testpartresult_reporter = pTVar6;
  if (local_410.m_result == false) {
    memset((iu_global_format_stringstream *)local_348,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_348);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,local_410.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_380);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_190 = 0x10000021f;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b8,(Fixed *)local_348,false);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_348);
    std::ios_base::~ios_base(local_2c8);
  }
  paVar1 = &local_410.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_410.m_message._M_dataplus._M_p,
                    local_410.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_380.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_380.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023f038;
  local_380.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_454);
  local_1b8._0_10_ = (longdouble)0 / (longdouble)(anonymous_namespace)::ld0._0_10_;
  local_348._0_8_ = &PTR__IMatcher_0023ed78;
  local_338.iv._10_6_ = 0;
  local_338.iv._0_4_ = (undefined4)local_1b8._0_10_;
  local_338.iv._4_2_ = (undefined2)((unkuint10)local_1b8._0_10_ >> 0x20);
  local_338.iv._6_1_ = (undefined1)((unkuint10)local_1b8._0_10_ >> 0x30);
  local_338.iv._7_1_ = (undefined1)((unkuint10)local_1b8._0_10_ >> 0x38);
  local_338.iv._8_2_ = (undefined2)((unkuint10)local_1b8._0_10_ >> 0x40);
  local_328 = (longdouble)1;
  iutest::detail::FloatingPointNearMatcher<long_double>::operator()
            (&local_3e8,(FloatingPointNearMatcher<long_double> *)local_348,(longdouble *)local_1b8);
  if (local_3e8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    local_38c = (longdouble)(anonymous_namespace)::ld0._0_10_;
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_348);
    std::ostream::_M_insert<long_double>((longdouble)0 / local_38c);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_348);
    std::ios_base::~ios_base(local_2c8);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_430,local_450,"LongDoubleNear(0/ld0, 1.0l)",(char *)&local_3e8,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,local_430._M_dataplus._M_p,(allocator<char> *)local_348);
    local_3c0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_3c0.m_part_result.super_iuCodeMessage.m_line = 0x220;
    local_3c0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_3c0,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_3c0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_3c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3c0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
    }
    if (local_450 != (detail *)local_440) {
      operator_delete(local_450,local_440[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_3e8.m_message._M_dataplus._M_p,
                    local_3e8.m_message.field_2._M_allocated_capacity + 1);
  }
  pTVar7 = iutest::TestFlag::GetInstance();
  pTVar7->m_test_flags = local_454.m_test_flags;
  local_338.iv._0_4_ = 0x7261654e;
  local_338.iv._4_2_ = 0x203a;
  local_348._8_8_ = 6;
  local_338.iv._6_1_ = 0;
  local_348._0_8_ = pp_Var3;
  iutest::detail::SPIFailureChecker::GetResult(&local_410,&local_380,(string *)local_348);
  if ((_func_int **)local_348._0_8_ != pp_Var3) {
    operator_delete((void *)local_348._0_8_,
                    CONCAT17(local_338.iv._7_1_,
                             CONCAT16(local_338.iv._6_1_,
                                      CONCAT24(local_338.iv._4_2_,local_338.iv._0_4_))) + 1);
  }
  local_380.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023f0b8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_380.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  local_380.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0023f0e0;
  pVVar8 = iutest::TestEnv::get_vars();
  pVVar8->m_testpartresult_reporter =
       local_380.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  if (local_410.m_result == false) {
    memset((iu_global_format_stringstream *)local_348,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_348);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,local_410.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_380);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_190 = 0x100000220;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b8,(Fixed *)local_348,false);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_348);
    std::ios_base::~ios_base(local_2c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_410.m_message._M_dataplus._M_p,
                    local_410.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(MatcherFailure, LongDoubleNear)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT(ld0, LongDoubleNear(1.0l, ld0)), "Near: " );
    CHECK_FAILURE( IUTEST_ASSERT_THAT(0/ld0, LongDoubleNear(0/ld0, 1.0l)), "Near: " );
}